

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_triple_parse_mutex_required(void)

{
  int iVar1;
  char *local_80;
  char *s;
  undefined4 local_70;
  float c;
  int b;
  int a;
  char *args3 [3];
  char *local_48;
  char *args2 [3];
  char *args [1];
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)args,0,"program");
  if (iVar1 == 0) {
    args2[2] = "program";
    local_48 = "program";
    args2[0] = "-c";
    args2[1] = "8.0";
    _b = "program";
    args3[0] = "--delta";
    args3[1] = "def";
    c = 0.0;
    local_70 = 0;
    s._4_4_ = 0x40e00000;
    local_80 = strdup("abc");
    if (local_80 == (char *)0x0) {
      pcStack_18 = "Failed to allocate";
    }
    else {
      cargo_add_mutex_group
                ((cargo_t)args[0],CARGO_MUTEXGRP_ONE_REQUIRED,"mg",(char *)0x0,(char *)0x0);
      cargo_add_option((cargo_t)args[0],0,"<!mg> --alpha -a","an option","i",&c);
      cargo_add_option((cargo_t)args[0],0,"<!mg> --beta -b","another option","i",&local_70);
      cargo_add_option((cargo_t)args[0],0,"--centauri -c","another option","f",(long)&s + 4);
      cargo_add_option((cargo_t)args[0],0,"--delta -d","another option","s",&local_80);
      iVar1 = cargo_parse((cargo_t)args[0],CARGO_SKIP_CHECK_MUTEX,1,1,args2 + 2);
      if (iVar1 == 0) {
        if ((local_80 == (char *)0x0) || (iVar1 = strcmp(local_80,"abc"), iVar1 != 0)) {
          pcStack_18 = "Expected s to be \'abc\'";
        }
        else {
          iVar1 = cargo_parse((cargo_t)args[0],CARGO_SKIP_CHECK_MUTEX,1,3,&local_48);
          if (iVar1 == 0) {
            if ((local_80 == (char *)0x0) || (iVar1 = strcmp(local_80,"abc"), iVar1 != 0)) {
              pcStack_18 = "Expected s to be \'abc\'";
            }
            else {
              iVar1 = cargo_parse((cargo_t)args[0],0,1,3,(char **)&b);
              if (-1 < iVar1) {
                pcStack_18 = "Parse did not fail 3";
              }
            }
          }
          else {
            pcStack_18 = "Parse failed 2";
          }
        }
      }
      else {
        pcStack_18 = "Parse failed 1";
      }
    }
    _cargo_xfree(&local_80);
    cargo_destroy((cargo_t *)args);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_triple_parse_mutex_required)
{
    char *args[] = { "program" };
    char *args2[] = { "program", "-c", "8.0" };
    char *args3[] = { "program", "--delta", "def" };
    int a = 0;
    int b = 0;
    float c = 7.0f;
    char *s = strdup("abc");
    cargo_assert(s, "Failed to allocate");

    ret |= cargo_add_mutex_group(cargo, CARGO_MUTEXGRP_ONE_REQUIRED, "mg", NULL, NULL);

    ret |= cargo_add_option(cargo, 0, "<!mg> --alpha -a", "an option", "i", &a);
    ret |= cargo_add_option(cargo, 0, "<!mg> --beta -b", "another option", "i", &b);
    ret |= cargo_add_option(cargo, 0, "--centauri -c", "another option", "f", &c);
    ret |= cargo_add_option(cargo, 0, "--delta -d", "another option", "s", &s);

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_MUTEX, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed 1");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_MUTEX, 1, sizeof(args2) / sizeof(args2[0]), args2);
    cargo_assert(ret == 0, "Parse failed 2");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, 0, 1, sizeof(args3) / sizeof(args3[0]), args3);
    cargo_assert(ret < 0, "Parse did not fail 3");

    _TEST_CLEANUP();
    _cargo_xfree(&s);
}